

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O3

void ncnn::transpose_pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  long lVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 (*pauVar21) [64];
  undefined1 (*pauVar22) [32];
  undefined1 (*pauVar23) [16];
  undefined4 *puVar24;
  size_t *psVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  
  iVar1 = A->elempack;
  psVar25 = (size_t *)&A->w;
  if (A->dims == 3) {
    psVar25 = &A->cstep;
  }
  iVar2 = (int)*psVar25;
  uVar19 = 0;
  lVar26 = (long)iVar2;
  lVar29 = (long)i;
  if (0xf < max_ii) {
    lVar31 = (long)(iVar2 * k);
    lVar28 = lVar29 * 0x40 + lVar31 * 4 + 0x3c0;
    lVar30 = lVar29 * 0x20 + lVar31 * 4 + 0x1e0;
    lVar17 = lVar29 * 0x10 + lVar31 * 4 + 0xf0;
    lVar31 = lVar31 * 4 + lVar29 * 4;
    uVar20 = 0;
    do {
      if (iVar1 == 0x10) {
        if (0xf < max_kk) {
          pauVar21 = (undefined1 (*) [64])((long)A->data + lVar28);
          iVar18 = 0xf;
          do {
            auVar57 = vunpcklps_avx512f(pauVar21[-0xf],pauVar21[-0xe]);
            auVar58 = vunpckhps_avx512f(pauVar21[-0xf],pauVar21[-0xe]);
            auVar59 = vunpcklps_avx512f(pauVar21[-0xd],pauVar21[-0xc]);
            auVar60 = vunpckhps_avx512f(pauVar21[-0xd],pauVar21[-0xc]);
            auVar61 = vunpcklps_avx512f(pauVar21[-0xb],pauVar21[-10]);
            auVar62 = vunpckhps_avx512f(pauVar21[-0xb],pauVar21[-10]);
            auVar63 = vunpcklps_avx512f(pauVar21[-9],pauVar21[-8]);
            auVar64 = vunpckhps_avx512f(pauVar21[-9],pauVar21[-8]);
            auVar65 = vunpcklps_avx512f(pauVar21[-7],pauVar21[-6]);
            auVar66 = vunpckhps_avx512f(pauVar21[-7],pauVar21[-6]);
            auVar67 = vunpcklps_avx512f(pauVar21[-5],pauVar21[-4]);
            auVar68 = vunpckhps_avx512f(pauVar21[-5],pauVar21[-4]);
            auVar69 = vunpcklps_avx512f(pauVar21[-3],pauVar21[-2]);
            auVar70 = vunpckhps_avx512f(pauVar21[-3],pauVar21[-2]);
            auVar71 = vunpcklps_avx512f(pauVar21[-1],*pauVar21);
            auVar72 = vunpckhps_avx512f(pauVar21[-1],*pauVar21);
            auVar73 = vunpcklpd_avx512f(auVar57,auVar59);
            auVar57 = vunpckhpd_avx512f(auVar57,auVar59);
            auVar59 = vunpcklpd_avx512f(auVar58,auVar60);
            auVar58 = vunpckhpd_avx512f(auVar58,auVar60);
            auVar60 = vunpcklpd_avx512f(auVar61,auVar63);
            auVar61 = vunpckhpd_avx512f(auVar61,auVar63);
            auVar63 = vunpcklpd_avx512f(auVar62,auVar64);
            auVar62 = vunpckhpd_avx512f(auVar62,auVar64);
            auVar64 = vunpcklpd_avx512f(auVar65,auVar67);
            auVar65 = vunpckhpd_avx512f(auVar65,auVar67);
            auVar67 = vunpcklpd_avx512f(auVar66,auVar68);
            auVar66 = vunpckhpd_avx512f(auVar66,auVar68);
            auVar68 = vunpcklpd_avx512f(auVar69,auVar71);
            auVar69 = vunpckhpd_avx512f(auVar69,auVar71);
            auVar71 = vunpcklpd_avx512f(auVar70,auVar72);
            auVar70 = vunpckhpd_avx512f(auVar70,auVar72);
            auVar72 = vshuff64x2_avx512f(auVar73,auVar60,0x88);
            auVar74 = vshuff64x2_avx512f(auVar64,auVar68,0x88);
            auVar75 = vshuff64x2_avx512f(auVar57,auVar61,0x88);
            auVar76 = vshuff64x2_avx512f(auVar65,auVar69,0x88);
            auVar77 = vshuff64x2_avx512f(auVar59,auVar63,0x88);
            auVar78 = vshuff64x2_avx512f(auVar67,auVar71,0x88);
            auVar79 = vshuff64x2_avx512f(auVar58,auVar62,0x88);
            auVar80 = vshuff64x2_avx512f(auVar66,auVar70,0x88);
            auVar60 = vshuff64x2_avx512f(auVar73,auVar60,0xdd);
            auVar64 = vshuff64x2_avx512f(auVar64,auVar68,0xdd);
            auVar57 = vshuff64x2_avx512f(auVar57,auVar61,0xdd);
            auVar61 = vshuff64x2_avx512f(auVar65,auVar69,0xdd);
            auVar59 = vshuff64x2_avx512f(auVar59,auVar63,0xdd);
            auVar63 = vshuff64x2_avx512f(auVar67,auVar71,0xdd);
            auVar58 = vshuff64x2_avx512f(auVar58,auVar62,0xdd);
            auVar62 = vshuff64x2_avx512f(auVar66,auVar70,0xdd);
            auVar65 = vshuff64x2_avx512f(auVar72,auVar74,0x88);
            auVar66 = vshuff64x2_avx512f(auVar75,auVar76,0x88);
            auVar67 = vshuff64x2_avx512f(auVar77,auVar78,0x88);
            auVar68 = vshuff64x2_avx512f(auVar79,auVar80,0x88);
            auVar69 = vshuff64x2_avx512f(auVar60,auVar64,0x88);
            auVar70 = vshuff64x2_avx512f(auVar57,auVar61,0x88);
            auVar71 = vshuff64x2_avx512f(auVar59,auVar63,0x88);
            auVar73 = vshuff64x2_avx512f(auVar58,auVar62,0x88);
            auVar72 = vshuff64x2_avx512f(auVar72,auVar74,0xdd);
            auVar74 = vshuff64x2_avx512f(auVar75,auVar76,0xdd);
            auVar75 = vshuff64x2_avx512f(auVar77,auVar78,0xdd);
            auVar76 = vshuff64x2_avx512f(auVar79,auVar80,0xdd);
            auVar60 = vshuff64x2_avx512f(auVar60,auVar64,0xdd);
            auVar57 = vshuff64x2_avx512f(auVar57,auVar61,0xdd);
            auVar59 = vshuff64x2_avx512f(auVar59,auVar63,0xdd);
            auVar58 = vshuff64x2_avx512f(auVar58,auVar62,0xdd);
            AT->data = (void *)auVar65._0_8_;
            AT->refcount = (int *)auVar65._8_8_;
            AT->elemsize = auVar65._16_8_;
            AT->elempack = auVar65._24_4_;
            *(int *)&AT->field_0x1c = auVar65._28_4_;
            AT->allocator = (Allocator *)auVar65._32_8_;
            AT->dims = auVar65._40_4_;
            AT->w = auVar65._44_4_;
            AT->h = auVar65._48_4_;
            AT->d = auVar65._52_4_;
            AT->c = auVar65._56_4_;
            *(int *)&AT->field_0x3c = auVar65._60_4_;
            *(undefined1 (*) [64])&AT->cstep = auVar66;
            *(undefined1 (*) [64])&AT[1].c = auVar67;
            *(undefined1 (*) [64])&AT[2].h = auVar68;
            *(undefined1 (*) [64])&AT[3].dims = auVar69;
            *(undefined1 (*) [64])&AT[4].allocator = auVar70;
            *(undefined1 (*) [64])&AT[5].elempack = auVar71;
            *(undefined1 (*) [64])&AT[6].elemsize = auVar73;
            AT[7].refcount = (int *)auVar72._0_8_;
            AT[7].elemsize = auVar72._8_8_;
            AT[7].elempack = auVar72._16_4_;
            *(int *)&AT[7].field_0x1c = auVar72._20_4_;
            AT[7].allocator = (Allocator *)auVar72._24_8_;
            AT[7].dims = auVar72._32_4_;
            AT[7].w = auVar72._36_4_;
            AT[7].h = auVar72._40_4_;
            AT[7].d = auVar72._44_4_;
            AT[7].c = auVar72._48_4_;
            *(int *)&AT[7].field_0x3c = auVar72._52_4_;
            AT[7].cstep = auVar72._56_8_;
            AT[8].data = (void *)auVar74._0_8_;
            AT[8].refcount = (int *)auVar74._8_8_;
            AT[8].elemsize = auVar74._16_8_;
            AT[8].elempack = auVar74._24_4_;
            *(int *)&AT[8].field_0x1c = auVar74._28_4_;
            AT[8].allocator = (Allocator *)auVar74._32_8_;
            AT[8].dims = auVar74._40_4_;
            AT[8].w = auVar74._44_4_;
            AT[8].h = auVar74._48_4_;
            AT[8].d = auVar74._52_4_;
            AT[8].c = auVar74._56_4_;
            *(int *)&AT[8].field_0x3c = auVar74._60_4_;
            *(undefined1 (*) [64])&AT[8].cstep = auVar75;
            *(undefined1 (*) [64])&AT[9].c = auVar76;
            *(undefined1 (*) [64])&AT[10].h = auVar60;
            *(undefined1 (*) [64])&AT[0xb].dims = auVar57;
            *(undefined1 (*) [64])&AT[0xc].allocator = auVar59;
            *(undefined1 (*) [64])&AT[0xd].elempack = auVar58;
            AT = (Mat *)&AT[0xe].elemsize;
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + (long)(iVar2 << 4) * 4);
            iVar18 = iVar18 + 0x10;
          } while (iVar18 < max_kk);
          goto LAB_0048d02e;
        }
      }
      else {
LAB_0048d02e:
        if (iVar1 == 8) {
          if (max_kk < 8) goto LAB_0048d422;
          pauVar22 = (undefined1 (*) [32])((long)A->data + lVar30);
          iVar18 = 7;
          do {
            auVar47 = vunpcklps_avx512vl(pauVar22[-0xf],pauVar22[-0xe]);
            auVar3 = vunpckhps_avx(pauVar22[-0xf],pauVar22[-0xe]);
            auVar12 = vunpcklps_avx(pauVar22[-0xd],pauVar22[-0xc]);
            auVar4 = vunpckhps_avx(pauVar22[-0xd],pauVar22[-0xc]);
            auVar83 = vunpcklps_avx(pauVar22[-0xb],pauVar22[-10]);
            auVar5 = vunpckhps_avx(pauVar22[-0xb],pauVar22[-10]);
            auVar13 = vunpcklps_avx(pauVar22[-9],pauVar22[-8]);
            auVar6 = vunpckhps_avx(pauVar22[-9],pauVar22[-8]);
            auVar14 = vunpcklps_avx(pauVar22[-7],pauVar22[-6]);
            auVar7 = vunpckhps_avx(pauVar22[-7],pauVar22[-6]);
            auVar15 = vunpcklps_avx(pauVar22[-5],pauVar22[-4]);
            auVar8 = vunpckhps_avx(pauVar22[-5],pauVar22[-4]);
            auVar16 = vunpcklps_avx(pauVar22[-3],pauVar22[-2]);
            auVar9 = vunpckhps_avx(pauVar22[-3],pauVar22[-2]);
            auVar51 = vunpcklps_avx(pauVar22[-1],*pauVar22);
            auVar50 = vunpckhps_avx(pauVar22[-1],*pauVar22);
            auVar48 = vunpcklpd_avx512vl(auVar47,auVar12);
            auVar47 = vunpckhpd_avx512vl(auVar47,auVar12);
            auVar49 = vunpcklpd_avx512vl(auVar3,auVar4);
            auVar3 = vunpckhpd_avx(auVar3,auVar4);
            auVar12 = vunpcklpd_avx(auVar83,auVar13);
            auVar4 = vunpckhpd_avx(auVar83,auVar13);
            auVar83 = vunpcklpd_avx(auVar5,auVar6);
            auVar5 = vunpckhpd_avx(auVar5,auVar6);
            auVar13 = vunpcklpd_avx(auVar14,auVar15);
            auVar6 = vunpckhpd_avx(auVar14,auVar15);
            auVar14 = vunpcklpd_avx(auVar7,auVar8);
            auVar7 = vunpckhpd_avx(auVar7,auVar8);
            auVar15 = vunpcklpd_avx(auVar16,auVar51);
            auVar8 = vunpckhpd_avx(auVar16,auVar51);
            auVar16 = vunpcklpd_avx(auVar9,auVar50);
            auVar9 = vunpckhpd_avx(auVar9,auVar50);
            auVar50 = vinsertf32x4_avx512vl(auVar13,auVar15._0_16_,1);
            auVar51 = vinsertf32x4_avx512vl(auVar47,auVar4._0_16_,1);
            auVar52 = vinsertf32x4_avx512vl(auVar6,auVar8._0_16_,1);
            auVar53 = vinsertf32x4_avx512vl(auVar49,auVar83._0_16_,1);
            auVar54 = vinsertf32x4_avx512vl(auVar14,auVar16._0_16_,1);
            auVar55 = vinsertf32x4_avx512vl(auVar3,auVar5._0_16_,1);
            auVar56 = vinsertf32x4_avx512vl(auVar7,auVar9._0_16_,1);
            auVar57 = vinsertf64x4_avx512f
                                (ZEXT3264(CONCAT1616(auVar12._0_16_,auVar48._0_16_)),auVar50,1);
            auVar58 = vinsertf64x4_avx512f(ZEXT3264(auVar51),auVar52,1);
            auVar59 = vinsertf64x4_avx512f(ZEXT3264(auVar53),auVar54,1);
            auVar60 = vinsertf64x4_avx512f(ZEXT3264(auVar55),auVar56,1);
            auVar61 = vinsertf64x4_avx512f(ZEXT3264(auVar13),auVar15,1);
            auVar62 = vinsertf64x4_avx512f(ZEXT3264(auVar48),auVar12,1);
            auVar61 = vshuff64x2_avx512f(auVar62,auVar61,0xdd);
            auVar62 = vinsertf64x4_avx512f(ZEXT3264(auVar6),auVar8,1);
            auVar63 = vinsertf64x4_avx512f(ZEXT3264(auVar47),auVar4,1);
            auVar62 = vshuff64x2_avx512f(auVar63,auVar62,0xdd);
            auVar63 = vinsertf64x4_avx512f(ZEXT3264(auVar14),auVar16,1);
            auVar64 = vinsertf64x4_avx512f(ZEXT3264(auVar49),auVar83,1);
            auVar63 = vshuff64x2_avx512f(auVar64,auVar63,0xdd);
            auVar64 = vinsertf64x4_avx512f(ZEXT3264(auVar7),auVar9,1);
            auVar65 = vinsertf64x4_avx512f(ZEXT3264(auVar3),auVar5,1);
            auVar64 = vshuff64x2_avx512f(auVar65,auVar64,0xdd);
            AT->data = (void *)auVar57._0_8_;
            AT->refcount = (int *)auVar57._8_8_;
            AT->elemsize = auVar57._16_8_;
            AT->elempack = auVar57._24_4_;
            *(int *)&AT->field_0x1c = auVar57._28_4_;
            AT->allocator = (Allocator *)auVar57._32_8_;
            AT->dims = auVar57._40_4_;
            AT->w = auVar57._44_4_;
            AT->h = auVar57._48_4_;
            AT->d = auVar57._52_4_;
            AT->c = auVar57._56_4_;
            *(int *)&AT->field_0x3c = auVar57._60_4_;
            *(undefined1 (*) [64])&AT->cstep = auVar58;
            *(undefined1 (*) [64])&AT[1].c = auVar59;
            *(undefined1 (*) [64])&AT[2].h = auVar60;
            *(undefined1 (*) [64])&AT[3].dims = auVar61;
            *(undefined1 (*) [64])&AT[4].allocator = auVar62;
            *(undefined1 (*) [64])&AT[5].elempack = auVar63;
            *(undefined1 (*) [64])&AT[6].elemsize = auVar64;
            AT = (Mat *)&AT[7].refcount;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + (long)(iVar2 * 8) * 4);
            iVar18 = iVar18 + 8;
          } while (iVar18 < max_kk);
        }
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_0048d422;
          pauVar23 = (undefined1 (*) [16])((long)A->data + lVar17);
          iVar18 = 3;
          do {
            auVar34 = vunpcklps_avx512vl(pauVar23[-0xf],pauVar23[-0xe]);
            auVar35 = vunpcklps_avx512vl(pauVar23[-0xd],pauVar23[-0xc]);
            auVar81 = vunpckhps_avx(pauVar23[-0xf],pauVar23[-0xe]);
            auVar82 = vunpckhps_avx(pauVar23[-0xd],pauVar23[-0xc]);
            auVar36 = vunpcklpd_avx512vl(auVar34,auVar35);
            auVar37 = vunpckhpd_avx512vl(auVar34,auVar35);
            auVar38 = vunpcklpd_avx512vl(auVar81,auVar82);
            auVar81 = vunpckhpd_avx(auVar81,auVar82);
            auVar35 = vunpcklps_avx(pauVar23[-0xb],pauVar23[-10]);
            auVar39 = vunpcklps_avx512vl(pauVar23[-9],pauVar23[-8]);
            auVar82 = vunpckhps_avx(pauVar23[-0xb],pauVar23[-10]);
            auVar34 = vunpckhps_avx(pauVar23[-9],pauVar23[-8]);
            auVar40 = vunpcklpd_avx512vl(auVar35,auVar39);
            auVar41 = vunpckhpd_avx512vl(auVar35,auVar39);
            auVar10 = vunpcklpd_avx(auVar82,auVar34);
            auVar82 = vunpckhpd_avx(auVar82,auVar34);
            auVar39 = vunpcklps_avx(pauVar23[-7],pauVar23[-6]);
            auVar42 = vunpcklps_avx512vl(pauVar23[-5],pauVar23[-4]);
            auVar34 = vunpckhps_avx(pauVar23[-7],pauVar23[-6]);
            auVar35 = vunpckhps_avx(pauVar23[-5],pauVar23[-4]);
            auVar43 = vunpcklpd_avx512vl(auVar39,auVar42);
            auVar44 = vunpckhpd_avx512vl(auVar39,auVar42);
            auVar42 = vunpcklpd_avx(auVar34,auVar35);
            auVar34 = vunpckhpd_avx(auVar34,auVar35);
            auVar11 = vunpcklps_avx(pauVar23[-3],pauVar23[-2]);
            auVar45 = vunpcklps_avx512vl(pauVar23[-1],*pauVar23);
            auVar35 = vunpckhps_avx(pauVar23[-3],pauVar23[-2]);
            auVar39 = vunpckhps_avx(pauVar23[-1],*pauVar23);
            auVar46 = vunpcklpd_avx512vl(auVar11,auVar45);
            auVar45 = vunpckhpd_avx512vl(auVar11,auVar45);
            auVar11 = vunpcklpd_avx(auVar35,auVar39);
            auVar35 = vunpckhpd_avx(auVar35,auVar39);
            AT->data = (void *)auVar36._0_8_;
            AT->refcount = (int *)auVar36._8_8_;
            AT->elemsize = auVar40._0_8_;
            AT->elempack = auVar40._8_4_;
            *(int *)&AT->field_0x1c = auVar40._12_4_;
            AT->allocator = (Allocator *)auVar43._0_8_;
            AT->dims = auVar43._8_4_;
            AT->w = auVar43._12_4_;
            AT->h = auVar46._0_4_;
            AT->d = auVar46._4_4_;
            AT->c = auVar46._8_4_;
            *(int *)&AT->field_0x3c = auVar46._12_4_;
            *(undefined1 (*) [16])&AT->cstep = auVar37;
            AT[1].refcount = (int *)auVar41._0_8_;
            AT[1].elemsize = auVar41._8_8_;
            AT[1].elempack = auVar44._0_4_;
            *(int *)&AT[1].field_0x1c = auVar44._4_4_;
            AT[1].allocator = (Allocator *)auVar44._8_8_;
            AT[1].dims = auVar45._0_4_;
            AT[1].w = auVar45._4_4_;
            AT[1].h = auVar45._8_4_;
            AT[1].d = auVar45._12_4_;
            AT[1].c = auVar38._0_4_;
            *(int *)&AT[1].field_0x3c = auVar38._4_4_;
            AT[1].cstep = auVar38._8_8_;
            AT[2].data = (void *)auVar10._0_8_;
            AT[2].refcount = (int *)auVar10._8_8_;
            AT[2].elemsize = auVar42._0_8_;
            AT[2].elempack = auVar42._8_4_;
            *(int *)&AT[2].field_0x1c = auVar42._12_4_;
            AT[2].allocator = (Allocator *)auVar11._0_8_;
            AT[2].dims = auVar11._8_4_;
            AT[2].w = auVar11._12_4_;
            AT[2].h = auVar81._0_4_;
            AT[2].d = auVar81._4_4_;
            AT[2].c = auVar81._8_4_;
            *(int *)&AT[2].field_0x3c = auVar81._12_4_;
            *(undefined1 (*) [16])&AT[2].cstep = auVar82;
            AT[3].refcount = (int *)auVar34._0_8_;
            AT[3].elemsize = auVar34._8_8_;
            AT[3].elempack = auVar35._0_4_;
            *(int *)&AT[3].field_0x1c = auVar35._4_4_;
            AT[3].allocator = (Allocator *)auVar35._8_8_;
            AT = (Mat *)&AT[3].dims;
            pauVar23 = (undefined1 (*) [16])(*pauVar23 + (long)(iVar2 * 4) * 4);
            iVar18 = iVar18 + 4;
          } while (iVar18 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          pauVar21 = (undefined1 (*) [64])((long)A->data + lVar31);
          iVar18 = max_kk;
          do {
            *(undefined1 (*) [64])AT = *pauVar21;
            AT = (Mat *)&AT->cstep;
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + lVar26 * 4);
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
        }
      }
LAB_0048d422:
      uVar19 = uVar20 + 0x10;
      uVar32 = uVar20 + 0x1f;
      lVar28 = lVar28 + 0x400;
      lVar30 = lVar30 + 0x200;
      lVar17 = lVar17 + 0x100;
      lVar31 = lVar31 + 0x40;
      uVar20 = uVar19;
    } while (uVar32 < (uint)max_ii);
  }
  lVar31 = (long)max_ii;
  if ((int)((uint)uVar19 | 7) < max_ii) {
    lVar17 = (long)(iVar2 * k);
    uVar20 = uVar19 & 0xffffffff;
    lVar28 = lVar29 + uVar20;
    lVar30 = lVar28 * 0x40 + lVar17 * 4 + 0x1c0;
    lVar33 = lVar28 * 0x20 + lVar17 * 4 + 0xe0;
    lVar28 = lVar28 * 0x10 + lVar17 * 4 + 0x70;
    lVar17 = lVar29 * 4 + lVar17 * 4 + uVar20 * 4;
    do {
      if (iVar1 == 0x10) {
        if (0xf < max_kk) {
          pauVar21 = (undefined1 (*) [64])((long)A->data + lVar30);
          iVar18 = 0xf;
          do {
            auVar57 = vunpcklps_avx512f(pauVar21[-7],pauVar21[-6]);
            auVar58 = vunpckhps_avx512f(pauVar21[-7],pauVar21[-6]);
            auVar59 = vunpcklps_avx512f(pauVar21[-5],pauVar21[-4]);
            auVar60 = vunpckhps_avx512f(pauVar21[-5],pauVar21[-4]);
            auVar61 = vunpcklps_avx512f(pauVar21[-3],pauVar21[-2]);
            auVar62 = vunpckhps_avx512f(pauVar21[-3],pauVar21[-2]);
            auVar63 = vunpcklps_avx512f(pauVar21[-1],*pauVar21);
            auVar64 = vunpckhps_avx512f(pauVar21[-1],*pauVar21);
            auVar65 = vunpcklpd_avx512f(auVar57,auVar59);
            auVar57 = vunpckhpd_avx512f(auVar57,auVar59);
            auVar59 = vunpcklpd_avx512f(auVar58,auVar60);
            auVar58 = vunpckhpd_avx512f(auVar58,auVar60);
            auVar60 = vunpcklpd_avx512f(auVar61,auVar63);
            auVar61 = vunpckhpd_avx512f(auVar61,auVar63);
            auVar63 = vunpcklpd_avx512f(auVar62,auVar64);
            auVar62 = vunpckhpd_avx512f(auVar62,auVar64);
            auVar64 = vshuff64x2_avx512f(auVar65,auVar60,0x88);
            auVar66 = vshuff64x2_avx512f(auVar57,auVar61,0x88);
            auVar67 = vshuff64x2_avx512f(auVar59,auVar63,0x88);
            auVar68 = vshuff64x2_avx512f(auVar58,auVar62,0x88);
            auVar60 = vshuff64x2_avx512f(auVar65,auVar60,0xdd);
            auVar57 = vshuff64x2_avx512f(auVar57,auVar61,0xdd);
            auVar59 = vshuff64x2_avx512f(auVar59,auVar63,0xdd);
            auVar58 = vshuff64x2_avx512f(auVar58,auVar62,0xdd);
            auVar61 = vshuff64x2_avx512f(auVar64,auVar66,0x88);
            auVar62 = vshuff64x2_avx512f(auVar67,auVar68,0x88);
            auVar63 = vshuff64x2_avx512f(auVar60,auVar57,0x88);
            auVar65 = vshuff64x2_avx512f(auVar59,auVar58,0x88);
            auVar64 = vshuff64x2_avx512f(auVar64,auVar66,0xdd);
            auVar66 = vshuff64x2_avx512f(auVar67,auVar68,0xdd);
            auVar57 = vshuff64x2_avx512f(auVar60,auVar57,0xdd);
            auVar58 = vshuff64x2_avx512f(auVar59,auVar58,0xdd);
            AT->data = (void *)auVar61._0_8_;
            AT->refcount = (int *)auVar61._8_8_;
            AT->elemsize = auVar61._16_8_;
            AT->elempack = auVar61._24_4_;
            *(int *)&AT->field_0x1c = auVar61._28_4_;
            AT->allocator = (Allocator *)auVar61._32_8_;
            AT->dims = auVar61._40_4_;
            AT->w = auVar61._44_4_;
            AT->h = auVar61._48_4_;
            AT->d = auVar61._52_4_;
            AT->c = auVar61._56_4_;
            *(int *)&AT->field_0x3c = auVar61._60_4_;
            *(undefined1 (*) [64])&AT->cstep = auVar62;
            *(undefined1 (*) [64])&AT[1].c = auVar63;
            *(undefined1 (*) [64])&AT[2].h = auVar65;
            *(undefined1 (*) [64])&AT[3].dims = auVar64;
            *(undefined1 (*) [64])&AT[4].allocator = auVar66;
            *(undefined1 (*) [64])&AT[5].elempack = auVar57;
            *(undefined1 (*) [64])&AT[6].elemsize = auVar58;
            AT = (Mat *)&AT[7].refcount;
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + (long)(iVar2 << 4) * 4);
            iVar18 = iVar18 + 0x10;
          } while (iVar18 < max_kk);
          goto LAB_0048d691;
        }
      }
      else {
LAB_0048d691:
        if (iVar1 == 8) {
          if (max_kk < 8) goto LAB_0048d88d;
          pauVar22 = (undefined1 (*) [32])((long)A->data + lVar33);
          iVar18 = 7;
          do {
            auVar3 = vunpcklps_avx(pauVar22[-7],pauVar22[-6]);
            auVar4 = vunpckhps_avx(pauVar22[-7],pauVar22[-6]);
            auVar9 = vunpcklps_avx(pauVar22[-5],pauVar22[-4]);
            auVar5 = vunpckhps_avx(pauVar22[-5],pauVar22[-4]);
            auVar12 = vunpcklps_avx(pauVar22[-3],pauVar22[-2]);
            auVar6 = vunpckhps_avx(pauVar22[-3],pauVar22[-2]);
            auVar83 = vunpcklps_avx(pauVar22[-1],*pauVar22);
            auVar7 = vunpckhps_avx(pauVar22[-1],*pauVar22);
            auVar8 = vunpcklpd_avx(auVar3,auVar9);
            auVar3 = vunpckhpd_avx(auVar3,auVar9);
            auVar9 = vunpcklpd_avx(auVar4,auVar5);
            auVar4 = vunpckhpd_avx(auVar4,auVar5);
            auVar50 = vunpcklpd_avx(auVar12,auVar83);
            auVar5 = vunpckhpd_avx(auVar12,auVar83);
            auVar12 = vunpcklpd_avx(auVar6,auVar7);
            auVar6 = vunpckhpd_avx(auVar6,auVar7);
            auVar34 = auVar50._0_16_;
            auVar82 = auVar3._0_16_;
            auVar35 = auVar5._0_16_;
            auVar83._16_16_ = auVar12._0_16_;
            auVar83._0_16_ = auVar9._0_16_;
            auVar81 = auVar4._0_16_;
            auVar39 = auVar6._0_16_;
            auVar7 = vperm2f128_avx(auVar8,auVar50,0x31);
            auVar3 = vperm2f128_avx(auVar3,auVar5,0x31);
            auVar5 = vperm2f128_avx(auVar9,auVar12,0x31);
            auVar4 = vperm2f128_avx(auVar4,auVar6,0x31);
            AT->data = (void *)SUB168(auVar8._0_16_,0);
            AT->refcount = (int *)SUB168(auVar8._0_16_,8);
            AT->elemsize = auVar34._0_8_;
            AT->elempack = auVar34._8_4_;
            *(int *)&AT->field_0x1c = auVar34._12_4_;
            AT->allocator = (Allocator *)auVar82._0_8_;
            AT->dims = auVar82._8_4_;
            AT->w = auVar82._12_4_;
            AT->h = auVar35._0_4_;
            AT->d = auVar35._4_4_;
            AT->c = auVar35._8_4_;
            *(int *)&AT->field_0x3c = auVar35._12_4_;
            *(undefined1 (*) [32])&AT->cstep = auVar83;
            AT[1].elempack = auVar81._0_4_;
            *(int *)&AT[1].field_0x1c = auVar81._4_4_;
            AT[1].allocator = (Allocator *)auVar81._8_8_;
            AT[1].dims = auVar39._0_4_;
            AT[1].w = auVar39._4_4_;
            AT[1].h = auVar39._8_4_;
            AT[1].d = auVar39._12_4_;
            *(undefined1 (*) [32])&AT[1].c = auVar7;
            AT[2].elemsize = auVar3._0_8_;
            AT[2].elempack = auVar3._8_4_;
            *(int *)&AT[2].field_0x1c = auVar3._12_4_;
            AT[2].allocator = (Allocator *)auVar3._16_8_;
            AT[2].dims = auVar3._24_4_;
            AT[2].w = auVar3._28_4_;
            *(undefined1 (*) [32])&AT[2].h = auVar5;
            AT[3].refcount = (int *)auVar4._0_8_;
            AT[3].elemsize = auVar4._8_8_;
            AT[3].elempack = auVar4._16_4_;
            *(int *)&AT[3].field_0x1c = auVar4._20_4_;
            AT[3].allocator = (Allocator *)auVar4._24_8_;
            AT = (Mat *)&AT[3].dims;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + (long)(iVar2 * 8) * 4);
            iVar18 = iVar18 + 8;
          } while (iVar18 < max_kk);
        }
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_0048d88d;
          pauVar23 = (undefined1 (*) [16])((long)A->data + lVar28);
          iVar18 = 3;
          do {
            auVar81 = vunpcklps_avx(pauVar23[-7],pauVar23[-6]);
            auVar35 = vunpcklps_avx(pauVar23[-5],pauVar23[-4]);
            auVar82 = vunpckhps_avx(pauVar23[-7],pauVar23[-6]);
            auVar34 = vunpckhps_avx(pauVar23[-5],pauVar23[-4]);
            auVar10 = vunpcklpd_avx(auVar81,auVar35);
            auVar81 = vunpckhpd_avx(auVar81,auVar35);
            auVar42 = vunpcklpd_avx(auVar82,auVar34);
            auVar82 = vunpckhpd_avx(auVar82,auVar34);
            auVar34 = vunpcklps_avx(pauVar23[-3],pauVar23[-2]);
            auVar36 = vunpcklps_avx(pauVar23[-1],*pauVar23);
            auVar35 = vunpckhps_avx(pauVar23[-3],pauVar23[-2]);
            auVar39 = vunpckhps_avx(pauVar23[-1],*pauVar23);
            auVar11 = vunpcklpd_avx(auVar34,auVar36);
            auVar34 = vunpckhpd_avx(auVar34,auVar36);
            auVar36 = vunpcklpd_avx(auVar35,auVar39);
            auVar35 = vunpckhpd_avx(auVar35,auVar39);
            AT->data = (void *)auVar10._0_8_;
            AT->refcount = (int *)auVar10._8_8_;
            AT->elemsize = auVar11._0_8_;
            AT->elempack = auVar11._8_4_;
            *(int *)&AT->field_0x1c = auVar11._12_4_;
            AT->allocator = (Allocator *)auVar81._0_8_;
            AT->dims = auVar81._8_4_;
            AT->w = auVar81._12_4_;
            AT->h = auVar34._0_4_;
            AT->d = auVar34._4_4_;
            AT->c = auVar34._8_4_;
            *(int *)&AT->field_0x3c = auVar34._12_4_;
            *(undefined1 (*) [16])&AT->cstep = auVar42;
            AT[1].refcount = (int *)auVar36._0_8_;
            AT[1].elemsize = auVar36._8_8_;
            AT[1].elempack = auVar82._0_4_;
            *(int *)&AT[1].field_0x1c = auVar82._4_4_;
            AT[1].allocator = (Allocator *)auVar82._8_8_;
            AT[1].dims = auVar35._0_4_;
            AT[1].w = auVar35._4_4_;
            AT[1].h = auVar35._8_4_;
            AT[1].d = auVar35._12_4_;
            AT = (Mat *)&AT[1].c;
            pauVar23 = (undefined1 (*) [16])(*pauVar23 + (long)(iVar2 * 4) * 4);
            iVar18 = iVar18 + 4;
          } while (iVar18 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          pauVar22 = (undefined1 (*) [32])((long)A->data + lVar17);
          iVar18 = max_kk;
          do {
            *(undefined1 (*) [32])AT = *pauVar22;
            AT = (Mat *)&AT->allocator;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + lVar26 * 4);
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
        }
      }
LAB_0048d88d:
      uVar19 = uVar20 + 8;
      lVar27 = uVar20 + 0xf;
      lVar30 = lVar30 + 0x200;
      lVar33 = lVar33 + 0x100;
      lVar28 = lVar28 + 0x80;
      lVar17 = lVar17 + 0x20;
      uVar20 = uVar19;
    } while (lVar27 < lVar31);
  }
  if ((int)((uint)uVar19 | 3) < max_ii) {
    lVar17 = (long)(iVar2 * k);
    uVar20 = uVar19 & 0xffffffff;
    lVar30 = lVar29 + uVar20;
    lVar28 = lVar30 * 0x40 + lVar17 * 4 + 0xc0;
    lVar33 = lVar30 * 0x20 + lVar17 * 4 + 0x60;
    lVar30 = lVar30 * 0x10 + lVar17 * 4 + 0x30;
    lVar17 = lVar17 * 4 + lVar29 * 4 + uVar20 * 4;
    do {
      if (iVar1 == 0x10) {
        if (0xf < max_kk) {
          pauVar21 = (undefined1 (*) [64])((long)A->data + lVar28);
          iVar18 = 0xf;
          do {
            auVar57 = vunpcklps_avx512f(pauVar21[-3],pauVar21[-2]);
            auVar58 = vunpckhps_avx512f(pauVar21[-3],pauVar21[-2]);
            auVar59 = vunpcklps_avx512f(pauVar21[-1],*pauVar21);
            auVar60 = vunpckhps_avx512f(pauVar21[-1],*pauVar21);
            auVar61 = vunpcklpd_avx512f(auVar57,auVar59);
            auVar57 = vunpckhpd_avx512f(auVar57,auVar59);
            auVar59 = vunpcklpd_avx512f(auVar58,auVar60);
            auVar58 = vunpckhpd_avx512f(auVar58,auVar60);
            auVar60 = vshuff64x2_avx512f(auVar61,auVar57,0x88);
            auVar62 = vshuff64x2_avx512f(auVar59,auVar58,0x88);
            auVar57 = vshuff64x2_avx512f(auVar61,auVar57,0xdd);
            auVar58 = vshuff64x2_avx512f(auVar59,auVar58,0xdd);
            auVar59 = vshuff64x2_avx512f(auVar60,auVar62,0x88);
            auVar61 = vshuff64x2_avx512f(auVar57,auVar58,0x88);
            auVar60 = vshuff64x2_avx512f(auVar60,auVar62,0xdd);
            auVar57 = vshuff64x2_avx512f(auVar57,auVar58,0xdd);
            AT->data = (void *)auVar59._0_8_;
            AT->refcount = (int *)auVar59._8_8_;
            AT->elemsize = auVar59._16_8_;
            AT->elempack = auVar59._24_4_;
            *(int *)&AT->field_0x1c = auVar59._28_4_;
            AT->allocator = (Allocator *)auVar59._32_8_;
            AT->dims = auVar59._40_4_;
            AT->w = auVar59._44_4_;
            AT->h = auVar59._48_4_;
            AT->d = auVar59._52_4_;
            AT->c = auVar59._56_4_;
            *(int *)&AT->field_0x3c = auVar59._60_4_;
            *(undefined1 (*) [64])&AT->cstep = auVar61;
            *(undefined1 (*) [64])&AT[1].c = auVar60;
            *(undefined1 (*) [64])&AT[2].h = auVar57;
            AT = (Mat *)&AT[3].dims;
            iVar18 = iVar18 + 0x10;
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + (long)(iVar2 << 4) * 4);
          } while (iVar18 < max_kk);
          goto LAB_0048da41;
        }
      }
      else {
LAB_0048da41:
        if (iVar1 == 8) {
          if (max_kk < 8) goto LAB_0048db6d;
          pauVar22 = (undefined1 (*) [32])((long)A->data + lVar33);
          iVar18 = 7;
          do {
            auVar3 = vunpcklps_avx(pauVar22[-3],pauVar22[-2]);
            auVar4 = vunpckhps_avx(pauVar22[-3],pauVar22[-2]);
            auVar7 = vunpcklps_avx(pauVar22[-1],*pauVar22);
            auVar5 = vunpckhps_avx(pauVar22[-1],*pauVar22);
            auVar6 = vunpcklpd_avx(auVar3,auVar7);
            auVar3 = vunpckhpd_avx(auVar3,auVar7);
            auVar7 = vunpcklpd_avx(auVar4,auVar5);
            auVar4 = vunpckhpd_avx(auVar4,auVar5);
            auVar82 = auVar3._0_16_;
            auVar34 = auVar7._0_16_;
            auVar81 = auVar4._0_16_;
            auVar3 = vperm2f128_avx(auVar6,auVar3,0x31);
            auVar4 = vperm2f128_avx(auVar7,auVar4,0x31);
            AT->data = (void *)SUB168(auVar6._0_16_,0);
            AT->refcount = (int *)SUB168(auVar6._0_16_,8);
            AT->elemsize = auVar82._0_8_;
            AT->elempack = auVar82._8_4_;
            *(int *)&AT->field_0x1c = auVar82._12_4_;
            AT->allocator = (Allocator *)auVar34._0_8_;
            AT->dims = auVar34._8_4_;
            AT->w = auVar34._12_4_;
            AT->h = auVar81._0_4_;
            AT->d = auVar81._4_4_;
            AT->c = auVar81._8_4_;
            *(int *)&AT->field_0x3c = auVar81._12_4_;
            *(undefined1 (*) [32])&AT->cstep = auVar3;
            AT[1].elempack = auVar4._0_4_;
            *(int *)&AT[1].field_0x1c = auVar4._4_4_;
            AT[1].allocator = (Allocator *)auVar4._8_8_;
            AT[1].dims = auVar4._16_4_;
            AT[1].w = auVar4._20_4_;
            AT[1].h = auVar4._24_4_;
            AT[1].d = auVar4._28_4_;
            AT = (Mat *)&AT[1].c;
            iVar18 = iVar18 + 8;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + (long)(iVar2 * 8) * 4);
          } while (iVar18 < max_kk);
        }
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_0048db6d;
          pauVar23 = (undefined1 (*) [16])((long)A->data + lVar30);
          iVar18 = 3;
          do {
            auVar81 = vunpcklps_avx(pauVar23[-3],pauVar23[-2]);
            auVar39 = vunpcklps_avx(pauVar23[-1],*pauVar23);
            auVar82 = vunpckhps_avx(pauVar23[-3],pauVar23[-2]);
            auVar34 = vunpckhps_avx(pauVar23[-1],*pauVar23);
            auVar35 = vunpcklpd_avx(auVar81,auVar39);
            auVar81 = vunpckhpd_avx(auVar81,auVar39);
            auVar39 = vunpcklpd_avx(auVar82,auVar34);
            auVar82 = vunpckhpd_avx(auVar82,auVar34);
            AT->data = (void *)auVar35._0_8_;
            AT->refcount = (int *)auVar35._8_8_;
            AT->elemsize = auVar81._0_8_;
            AT->elempack = auVar81._8_4_;
            *(int *)&AT->field_0x1c = auVar81._12_4_;
            AT->allocator = (Allocator *)auVar39._0_8_;
            AT->dims = auVar39._8_4_;
            AT->w = auVar39._12_4_;
            AT->h = auVar82._0_4_;
            AT->d = auVar82._4_4_;
            AT->c = auVar82._8_4_;
            *(int *)&AT->field_0x3c = auVar82._12_4_;
            AT = (Mat *)&AT->cstep;
            iVar18 = iVar18 + 4;
            pauVar23 = (undefined1 (*) [16])(*pauVar23 + (long)(iVar2 * 4) * 4);
          } while (iVar18 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          pauVar23 = (undefined1 (*) [16])((long)A->data + lVar17);
          iVar18 = max_kk;
          do {
            *(undefined1 (*) [16])AT = *pauVar23;
            AT = (Mat *)&AT->elemsize;
            pauVar23 = (undefined1 (*) [16])(*pauVar23 + lVar26 * 4);
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
        }
      }
LAB_0048db6d:
      uVar19 = uVar20 + 4;
      lVar27 = uVar20 + 7;
      lVar28 = lVar28 + 0x100;
      lVar33 = lVar33 + 0x80;
      lVar30 = lVar30 + 0x40;
      lVar17 = lVar17 + 0x10;
      uVar20 = uVar19;
    } while (lVar27 < lVar31);
  }
  if ((int)((uint)uVar19 | 1) < max_ii) {
    lVar28 = (long)(iVar2 * k);
    uVar20 = (ulong)(int)(uint)uVar19;
    lVar30 = uVar20 + lVar29;
    lVar17 = lVar30 * 0x40 + lVar28 * 4 + 0x40;
    lVar33 = lVar30 * 0x20 + lVar28 * 4 + 0x20;
    lVar30 = lVar30 * 0x10 + lVar28 * 4 + 0x10;
    lVar28 = lVar29 * 4 + uVar20 * 4 + lVar28 * 4 + 4;
    do {
      if (iVar1 == 0x10) {
        if (0xf < max_kk) {
          pauVar21 = (undefined1 (*) [64])((long)A->data + lVar17);
          iVar18 = 0xf;
          do {
            auVar57 = vunpcklps_avx512f(pauVar21[-1],*pauVar21);
            auVar58 = vunpckhps_avx512f(pauVar21[-1],*pauVar21);
            auVar59 = vshuff64x2_avx512f(auVar57,auVar58,0x88);
            auVar57 = vshuff64x2_avx512f(auVar57,auVar58,0xdd);
            auVar58 = vshuff64x2_avx512f(auVar59,auVar57,0x88);
            auVar57 = vshuff64x2_avx512f(auVar59,auVar57,0xdd);
            AT->data = (void *)auVar58._0_8_;
            AT->refcount = (int *)auVar58._8_8_;
            AT->elemsize = auVar58._16_8_;
            AT->elempack = auVar58._24_4_;
            *(int *)&AT->field_0x1c = auVar58._28_4_;
            AT->allocator = (Allocator *)auVar58._32_8_;
            AT->dims = auVar58._40_4_;
            AT->w = auVar58._44_4_;
            AT->h = auVar58._48_4_;
            AT->d = auVar58._52_4_;
            AT->c = auVar58._56_4_;
            *(int *)&AT->field_0x3c = auVar58._60_4_;
            *(undefined1 (*) [64])&AT->cstep = auVar57;
            AT = (Mat *)&AT[1].c;
            iVar18 = iVar18 + 0x10;
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + (long)(iVar2 << 4) * 4);
          } while (iVar18 < max_kk);
          goto LAB_0048dcb9;
        }
      }
      else {
LAB_0048dcb9:
        if (iVar1 == 8) {
          if (max_kk < 8) goto LAB_0048dd83;
          pauVar22 = (undefined1 (*) [32])((long)A->data + lVar33);
          iVar18 = 7;
          do {
            auVar4 = vunpcklps_avx(pauVar22[-1],*pauVar22);
            auVar3 = vunpckhps_avx(pauVar22[-1],*pauVar22);
            auVar81 = auVar3._0_16_;
            auVar3 = vperm2f128_avx(auVar4,auVar3,0x31);
            AT->data = (void *)SUB168(auVar4._0_16_,0);
            AT->refcount = (int *)SUB168(auVar4._0_16_,8);
            AT->elemsize = auVar81._0_8_;
            AT->elempack = auVar81._8_4_;
            *(int *)&AT->field_0x1c = auVar81._12_4_;
            AT->allocator = (Allocator *)auVar3._0_8_;
            AT->dims = auVar3._8_4_;
            AT->w = auVar3._12_4_;
            AT->h = auVar3._16_4_;
            AT->d = auVar3._20_4_;
            AT->c = auVar3._24_4_;
            *(int *)&AT->field_0x3c = auVar3._28_4_;
            AT = (Mat *)&AT->cstep;
            iVar18 = iVar18 + 8;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + (long)(iVar2 * 8) * 4);
          } while (iVar18 < max_kk);
        }
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_0048dd83;
          pauVar23 = (undefined1 (*) [16])((long)A->data + lVar30);
          iVar18 = 3;
          do {
            auVar82 = vunpcklps_avx(pauVar23[-1],*pauVar23);
            auVar81 = vunpckhps_avx(pauVar23[-1],*pauVar23);
            AT->data = (void *)auVar82._0_8_;
            AT->refcount = (int *)auVar82._8_8_;
            AT->elemsize = auVar81._0_8_;
            AT->elempack = auVar81._8_4_;
            *(int *)&AT->field_0x1c = auVar81._12_4_;
            AT = (Mat *)&AT->allocator;
            iVar18 = iVar18 + 4;
            pauVar23 = (undefined1 (*) [16])(*pauVar23 + (long)(iVar2 * 4) * 4);
          } while (iVar18 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          puVar24 = (undefined4 *)((long)A->data + lVar28);
          iVar18 = max_kk;
          do {
            *(undefined4 *)&AT->data = puVar24[-1];
            *(undefined4 *)((long)&AT->data + 4) = *puVar24;
            AT = (Mat *)&AT->refcount;
            puVar24 = puVar24 + lVar26;
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
        }
      }
LAB_0048dd83:
      uVar19 = uVar20 + 2;
      lVar27 = uVar20 + 3;
      lVar17 = lVar17 + 0x80;
      lVar33 = lVar33 + 0x40;
      lVar30 = lVar30 + 0x20;
      lVar28 = lVar28 + 8;
      uVar20 = uVar19;
    } while (lVar27 < lVar31);
  }
  if ((int)uVar19 < max_ii) {
    lVar27 = (long)(k * iVar2);
    lVar33 = (long)(int)uVar19;
    lVar17 = lVar33 + lVar29;
    lVar28 = lVar17 * 0x40 + lVar27 * 4;
    lVar30 = lVar17 * 0x20 + lVar27 * 4;
    lVar17 = lVar17 * 0x10 + lVar27 * 4;
    lVar29 = lVar29 * 4 + lVar33 * 4 + lVar27 * 4;
    do {
      if (iVar1 == 0x10) {
        if (0xf < max_kk) {
          pauVar21 = (undefined1 (*) [64])((long)A->data + lVar28);
          iVar18 = 0xf;
          do {
            *(undefined1 (*) [64])AT = *pauVar21;
            AT = (Mat *)&AT->cstep;
            iVar18 = iVar18 + 0x10;
            pauVar21 = (undefined1 (*) [64])(*pauVar21 + (long)(iVar2 << 4) * 4);
          } while (iVar18 < max_kk);
          goto LAB_0048de70;
        }
      }
      else {
LAB_0048de70:
        if (iVar1 == 8) {
          if (max_kk < 8) goto LAB_0048defa;
          pauVar22 = (undefined1 (*) [32])((long)A->data + lVar30);
          iVar18 = 7;
          do {
            *(undefined1 (*) [32])AT = *pauVar22;
            AT = (Mat *)&AT->allocator;
            iVar18 = iVar18 + 8;
            pauVar22 = (undefined1 (*) [32])(*pauVar22 + (long)(iVar2 * 8) * 4);
          } while (iVar18 < max_kk);
        }
        if (iVar1 == 4) {
          if (max_kk < 4) goto LAB_0048defa;
          pauVar23 = (undefined1 (*) [16])((long)A->data + lVar17);
          iVar18 = 3;
          do {
            *(undefined1 (*) [16])AT = *pauVar23;
            AT = (Mat *)&AT->elemsize;
            iVar18 = iVar18 + 4;
            pauVar23 = (undefined1 (*) [16])(*pauVar23 + (long)(iVar2 * 4) * 4);
          } while (iVar18 < max_kk);
        }
        if (0 < max_kk && iVar1 == 1) {
          puVar24 = (undefined4 *)((long)A->data + lVar29);
          iVar18 = max_kk;
          do {
            *(undefined4 *)&AT->data = *puVar24;
            AT = (Mat *)((long)&AT->data + 4);
            puVar24 = puVar24 + lVar26;
            iVar18 = iVar18 + -1;
          } while (iVar18 != 0);
        }
      }
LAB_0048defa:
      lVar33 = lVar33 + 1;
      lVar28 = lVar28 + 0x40;
      lVar30 = lVar30 + 0x20;
      lVar17 = lVar17 + 0x10;
      lVar29 = lVar29 + 4;
    } while (lVar33 != lVar31);
  }
  return;
}

Assistant:

static void transpose_pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                __m512 _r8 = _mm512_load_ps(p0 + 16 * 8);
                __m512 _r9 = _mm512_load_ps(p0 + 16 * 9);
                __m512 _ra = _mm512_load_ps(p0 + 16 * 10);
                __m512 _rb = _mm512_load_ps(p0 + 16 * 11);
                __m512 _rc = _mm512_load_ps(p0 + 16 * 12);
                __m512 _rd = _mm512_load_ps(p0 + 16 * 13);
                __m512 _re = _mm512_load_ps(p0 + 16 * 14);
                __m512 _rf = _mm512_load_ps(p0 + 16 * 15);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += A_hstep * 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                __m256 _r8 = _mm256_load_ps(p0 + 8 * 8);
                __m256 _r9 = _mm256_load_ps(p0 + 8 * 9);
                __m256 _ra = _mm256_load_ps(p0 + 8 * 10);
                __m256 _rb = _mm256_load_ps(p0 + 8 * 11);
                __m256 _rc = _mm256_load_ps(p0 + 8 * 12);
                __m256 _rd = _mm256_load_ps(p0 + 8 * 13);
                __m256 _re = _mm256_load_ps(p0 + 8 * 14);
                __m256 _rf = _mm256_load_ps(p0 + 8 * 15);

                transpose8x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                __m512 _rr0 = _mm512_insertf32x8(_mm512_castps256_ps512(_r0), _r1, 1);
                __m512 _rr1 = _mm512_insertf32x8(_mm512_castps256_ps512(_r2), _r3, 1);
                __m512 _rr2 = _mm512_insertf32x8(_mm512_castps256_ps512(_r4), _r5, 1);
                __m512 _rr3 = _mm512_insertf32x8(_mm512_castps256_ps512(_r6), _r7, 1);
                __m512 _rr4 = _mm512_insertf32x8(_mm512_castps256_ps512(_r8), _r9, 1);
                __m512 _rr5 = _mm512_insertf32x8(_mm512_castps256_ps512(_ra), _rb, 1);
                __m512 _rr6 = _mm512_insertf32x8(_mm512_castps256_ps512(_rc), _rd, 1);
                __m512 _rr7 = _mm512_insertf32x8(_mm512_castps256_ps512(_re), _rf, 1);

                _mm512_store_ps(pp, _rr0);
                _mm512_store_ps(pp + 16 * 1, _rr1);
                _mm512_store_ps(pp + 16 * 2, _rr2);
                _mm512_store_ps(pp + 16 * 3, _rr3);
                _mm512_store_ps(pp + 16 * 4, _rr4);
                _mm512_store_ps(pp + 16 * 5, _rr5);
                _mm512_store_ps(pp + 16 * 6, _rr6);
                _mm512_store_ps(pp + 16 * 7, _rr7);
                pp += 128;
                p0 += A_hstep * 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                __m128 _r8 = _mm_load_ps(p0 + 4 * 8);
                __m128 _r9 = _mm_load_ps(p0 + 4 * 9);
                __m128 _ra = _mm_load_ps(p0 + 4 * 10);
                __m128 _rb = _mm_load_ps(p0 + 4 * 11);
                __m128 _rc = _mm_load_ps(p0 + 4 * 12);
                __m128 _rd = _mm_load_ps(p0 + 4 * 13);
                __m128 _re = _mm_load_ps(p0 + 4 * 14);
                __m128 _rf = _mm_load_ps(p0 + 4 * 15);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _MM_TRANSPOSE4_PS(_rc, _rd, _re, _rf);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _rc);
                _mm_store_ps(pp + 4 * 4, _r1);
                _mm_store_ps(pp + 4 * 5, _r5);
                _mm_store_ps(pp + 4 * 6, _r9);
                _mm_store_ps(pp + 4 * 7, _rd);
                _mm_store_ps(pp + 4 * 8, _r2);
                _mm_store_ps(pp + 4 * 9, _r6);
                _mm_store_ps(pp + 4 * 10, _ra);
                _mm_store_ps(pp + 4 * 11, _re);
                _mm_store_ps(pp + 4 * 12, _r3);
                _mm_store_ps(pp + 4 * 13, _r7);
                _mm_store_ps(pp + 4 * 14, _rb);
                _mm_store_ps(pp + 4 * 15, _rf);
                pp += 64;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_loadu_ps(p0));
                pp += 16;
                p0 += A_hstep;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                __m512 _r4 = _mm512_load_ps(p0 + 16 * 4);
                __m512 _r5 = _mm512_load_ps(p0 + 16 * 5);
                __m512 _r6 = _mm512_load_ps(p0 + 16 * 6);
                __m512 _r7 = _mm512_load_ps(p0 + 16 * 7);
                transpose16x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                pp += 128;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                __m256 _r4 = _mm256_load_ps(p0 + 8 * 4);
                __m256 _r5 = _mm256_load_ps(p0 + 8 * 5);
                __m256 _r6 = _mm256_load_ps(p0 + 8 * 6);
                __m256 _r7 = _mm256_load_ps(p0 + 8 * 7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += A_hstep * 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                __m128 _r4 = _mm_load_ps(p0 + 4 * 4);
                __m128 _r5 = _mm_load_ps(p0 + 4 * 5);
                __m128 _r6 = _mm_load_ps(p0 + 4 * 6);
                __m128 _r7 = _mm_load_ps(p0 + 4 * 7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += A_hstep;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16 * 1);
                __m512 _r2 = _mm512_load_ps(p0 + 16 * 2);
                __m512 _r3 = _mm512_load_ps(p0 + 16 * 3);
                transpose16x4_ps(_r0, _r1, _r2, _r3);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16 * 1, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                pp += 64;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8 * 1);
                __m256 _r2 = _mm256_load_ps(p0 + 8 * 2);
                __m256 _r3 = _mm256_load_ps(p0 + 8 * 3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8 * 1, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                pp += 32;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4 * 1);
                __m128 _r2 = _mm_load_ps(p0 + 4 * 2);
                __m128 _r3 = _mm_load_ps(p0 + 4 * 3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4 * 1, _r1);
                _mm_store_ps(pp + 4 * 2, _r2);
                _mm_store_ps(pp + 4 * 3, _r3);
                pp += 16;
                p0 += A_hstep * 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += A_hstep;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_load_ps(p0);
                __m512 _r1 = _mm512_load_ps(p0 + 16);
                transpose16x2_ps(_r0, _r1);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                pp += 32;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_load_ps(p0);
                __m256 _r1 = _mm256_load_ps(p0 + 8);
                transpose8x2_ps(_r0, _r1);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                pp += 16;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_load_ps(p0);
                __m128 _r1 = _mm_load_ps(p0 + 4);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += A_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[1];
                pp += 2;
                p0 += A_hstep;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 16;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += A_hstep * 16;
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 8;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += A_hstep * 8;
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii) * 4;

            int kk = 0;
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += A_hstep * 4;
            }
        }
#endif // __SSE2__
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + k * A_hstep + (i + ii);

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0 += A_hstep;
            }
        }
    }
}